

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int mov_mem_mem(em8051 *aCPU)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  ulong uVar5;
  int iVar4;
  
  uVar5 = (long)aCPU->mCodeMemSize - 1;
  bVar1 = aCPU->mCodeMem[(long)aCPU->mPC + 2U & uVar5];
  bVar2 = aCPU->mCodeMem[(long)(int)uVar5 & (long)aCPU->mPC + 1U];
  if ((long)(char)bVar2 < 0) {
    if (aCPU->sfrread == (em8051sfrread)0x0) {
      uVar3 = aCPU->mSFR[(ulong)bVar2 - 0x80];
    }
    else {
      iVar4 = (*aCPU->sfrread)(aCPU,(uint)bVar2);
      uVar3 = (uchar)iVar4;
    }
  }
  else {
    uVar3 = aCPU->mLowerData[(char)bVar2];
  }
  if ((char)bVar1 < '\0') {
    aCPU->mSFR[(ulong)bVar1 - 0x80] = uVar3;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,(uint)bVar1);
    }
  }
  else {
    aCPU->mLowerData[bVar1] = uVar3;
  }
  aCPU->mPC = aCPU->mPC + 3;
  return 1;
}

Assistant:

static int mov_mem_mem(struct em8051 *aCPU)
{
    int address1 = OPERAND2;
    int value = read_mem(aCPU, OPERAND1);

    if (address1 > 0x7f)
    {
        aCPU->mSFR[address1 - 0x80] = value;
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address1);
    }
    else
    {
        aCPU->mLowerData[address1] = value;
    }

    PC += 3;
    return 1;
}